

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

int __thiscall glslang::TScanContext::identifierOrReserved(TScanContext *this,bool reserved)

{
  bool bVar1;
  bool reserved_local;
  TScanContext *this_local;
  
  if (reserved) {
    reservedWord(this);
    this_local._4_4_ = 0;
  }
  else {
    bVar1 = TParseVersions::isForwardCompatible(&this->parseContext->super_TParseVersions);
    if (bVar1) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2e])
                (this->parseContext,&this->loc,"using future reserved keyword",this->tokenText,"");
    }
    this_local._4_4_ = identifierOrType(this);
  }
  return this_local._4_4_;
}

Assistant:

int TScanContext::identifierOrReserved(bool reserved)
{
    if (reserved) {
        reservedWord();

        return 0;
    }

    if (parseContext.isForwardCompatible())
        parseContext.warn(loc, "using future reserved keyword", tokenText, "");

    return identifierOrType();
}